

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

int metacall_register(char *name,_func_void_ptr_size_t_void_ptr_ptr_void_ptr *invoke,void **func,
                     metacall_value_id return_type,size_t size,...)

{
  uint uVar1;
  int iVar2;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  ulong in_R8;
  size_t iterator;
  va_list va;
  type_id types [16];
  undefined4 *local_160;
  uint *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb4;
  undefined4 local_148;
  type_id in_stack_fffffffffffffebc;
  function *in_stack_fffffffffffffec0;
  loader_register_invoke in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  ulong local_90;
  uint local_88 [2];
  undefined4 *local_80;
  undefined4 *local_78;
  undefined4 local_68 [16];
  ulong local_28;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_78 = &local_148;
  local_80 = (undefined4 *)&stack0x00000008;
  local_88[1] = 0x30;
  local_88[0] = 0x28;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_90 = 0; uVar1 = local_88[0], local_90 < local_28; local_90 = local_90 + 1) {
    in_stack_fffffffffffffea8 = local_88;
    if (local_88[0] < 0x29) {
      local_160 = (undefined4 *)((long)local_78 + (long)(int)local_88[0]);
      local_88[0] = local_88[0] + 8;
    }
    else {
      local_160 = local_80;
      local_80 = local_80 + 2;
    }
    local_68[local_90] = *local_160;
    in_stack_fffffffffffffeb4 = uVar1;
  }
  iVar2 = loader_register(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                          in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                          CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          (type_id *)in_stack_fffffffffffffea8);
  return iVar2;
}

Assistant:

int metacall_register(const char *name, void *(*invoke)(size_t, void *[], void *), void **func, enum metacall_value_id return_type, size_t size, ...)
{
	type_id types[METACALL_ARGS_SIZE];

	va_list va;

	va_start(va, size);

	size_t iterator;

	for (iterator = 0; iterator < size; ++iterator)
	{
		types[iterator] = (type_id)va_arg(va, int);
	}

	va_end(va);

	return loader_register(name, (loader_register_invoke)invoke, (function *)func, (type_id)return_type, size, (type_id *)types);
}